

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

QPoint __thiscall
QMdi::MinOverlapPlacer::place(MinOverlapPlacer *this,QSize *size,QList<QRect> *rects,QRect *domain)

{
  bool bVar1;
  const_iterator o;
  QRect *in_RCX;
  QList<QRect> *in_RDX;
  long in_FS_OFFSET;
  QRect *rect;
  QList<QRect> *__range1;
  QList<QRect> candidates;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QRect> *in_stack_00000068;
  QSize *in_stack_00000070;
  QRect *in_stack_ffffffffffffff90;
  const_iterator local_18;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QSize::isEmpty((QSize *)in_RCX);
  if (!bVar1) {
    bVar1 = QRect::isValid(in_stack_ffffffffffffff90);
    if (bVar1) {
      local_18.i = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
      local_18 = QList<QRect>::begin(in_stack_ffffffffffffff90);
      o = QList<QRect>::end(in_stack_ffffffffffffff90);
      while( true ) {
        bVar1 = QList<QRect>::const_iterator::operator!=(&local_18,o);
        if (!bVar1) break;
        in_stack_ffffffffffffff90 = QList<QRect>::const_iterator::operator*(&local_18);
        bVar1 = QRect::isValid(in_stack_ffffffffffffff90);
        if (!bVar1) {
          QPoint::QPoint((QPoint *)in_stack_ffffffffffffff90);
          goto LAB_0060d9f9;
        }
        QList<QRect>::const_iterator::operator++(&local_18);
      }
      getCandidatePlacements(in_stack_00000070,in_stack_00000068,__begin1.i);
      local_10 = findBestPlacement(in_RCX,in_RDX,(QList<QRect> *)in_stack_ffffffffffffff90);
      QList<QRect>::~QList((QList<QRect> *)0x60d9f9);
      goto LAB_0060d9f9;
    }
  }
  QPoint::QPoint((QPoint *)in_stack_ffffffffffffff90);
LAB_0060d9f9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QPoint MinOverlapPlacer::place(const QSize &size, const QList<QRect> &rects,
                               const QRect &domain) const
{
    if (size.isEmpty() || !domain.isValid())
        return QPoint();
    for (const QRect &rect : rects) {
        if (!rect.isValid())
            return QPoint();
    }

    QList<QRect> candidates = getCandidatePlacements(size, rects, domain);
    return findBestPlacement(domain, rects, candidates);
}